

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O0

uint8_t * __thiscall pktalloc::Allocator::allocateFromNewWindow(Allocator *this,uint units)

{
  uint uVar1;
  bool bVar2;
  LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *this_00;
  uint in_ESI;
  long in_RDI;
  uint8_t *data;
  AllocationHeader *regionHeader;
  WindowHeader *window;
  uint8_t *headerStart;
  uint newSize;
  size_t in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  uint elements;
  WindowHeader *this_01;
  WindowHeader **local_28;
  
  elements = (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  this_00 = (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)
            SIMDSafeAllocate(in_stack_ffffffffffffffa8);
  if (this_00 == (LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)0x0) {
    local_28 = (WindowHeader **)0x0;
  }
  else {
    this_01 = (WindowHeader *)this_00;
    CustomBitSet<2048U>::ClearAll((CustomBitSet<2048U> *)this_00);
    CustomBitSet<2048U>::SetRange(&this_01->Used,0,in_ESI);
    *(uint *)((long)&this_01->field_0xe0 + 0x20) = 0x800 - in_ESI;
    *(uint *)((long)&this_01->field_0xe0 + 0x24) = in_ESI;
    *(undefined1 *)((long)&this_01->field_0xe0 + 0x2c) = 0;
    *(undefined4 *)((long)&this_01->field_0xe0 + 0x28) = 0xffffffff;
    uVar1 = *(uint *)(in_RDI + 0xd0);
    bVar2 = LightVector<pktalloc::Allocator::WindowHeader_*,_25U>::SetSize_Copy
                      ((LightVector<pktalloc::Allocator::WindowHeader_*,_25U> *)this_01,elements);
    if (bVar2) {
      *(WindowHeader **)(*(long *)(in_RDI + 0xd8) + (ulong)uVar1 * 8) = this_01;
    }
    this_00[1].PreallocatedData[8] = this_01;
    *(uint *)(this_00[1].PreallocatedData + 9) = in_ESI;
    local_28 = this_00[1].PreallocatedData + 0xc;
  }
  return (uint8_t *)local_28;
}

Assistant:

uint8_t* Allocator::allocateFromNewWindow(unsigned units)
{
    ALLOC_DEBUG_INTEGRITY_CHECK();

    uint8_t* headerStart = SIMDSafeAllocate(kWindowSizeBytes);
    if (!headerStart) {
        return nullptr; // Allocation failure
    }

    // Update window header
    WindowHeader* window = (WindowHeader*)headerStart;
    window->Used.ClearAll();
    window->Used.SetRange(0, units);
    window->FreeUnitCount = kWindowMaxUnits - units;
    window->ResumeScanOffset = units;
    window->Preallocated = false;
    PKTALLOC_DEBUG_ASSERT(PreferredWindows.GetSize() == 0);
    window->FullListIndex = kNotInFullList;
    PreferredWindows.Append(window);

    // Carve out region
    AllocationHeader* regionHeader = (AllocationHeader*)(headerStart + kWindowHeaderBytes);
#ifdef PKTALLOC_DEBUG
    regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
    regionHeader->Header = window;
    regionHeader->UsedUnits = units;

    uint8_t* data = (uint8_t*)regionHeader + kUnitSize;
#ifdef PKTALLOC_SCRUB_MEMORY
    memset(data, 0, (units - 1) * kUnitSize);
#endif // PKTALLOC_SCRUB_MEMORY
    PKTALLOC_DEBUG_ASSERT((uintptr_t)data % kUnitSize == 0);

    ALLOC_DEBUG_INTEGRITY_CHECK();

    return data;
}